

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerTee(I64ToI32Lowering *this,LocalSet *curr)

{
  Builder *pBVar1;
  Index IVar2;
  Index index;
  LocalSet *any;
  LocalGet *pLVar3;
  LocalSet *append;
  Block *expression;
  undefined1 local_68 [8];
  TempVar highBits;
  TempVar tmp;
  
  fetchOutParam((TempVar *)local_68,this,curr->value);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  (curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 2;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
  any = Builder::makeLocalSet(pBVar1,IVar2,(Expression *)curr);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = curr->index;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
  pLVar3 = Builder::makeLocalGet(pBVar1,index,(Type)0x2);
  append = Builder::makeLocalSet(pBVar1,IVar2 + 1,(Expression *)pLVar3);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
  pLVar3 = Builder::makeLocalGet(pBVar1,IVar2,(Type)0x2);
  expression = Builder::blockify<wasm::LocalGet*>
                         ((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                          (Expression *)any,(Expression *)append,pLVar3);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  setOutParam(this,(Expression *)expression,(TempVar *)local_68);
  TempVar::~TempVar((TempVar *)&highBits.ty);
  TempVar::~TempVar((TempVar *)local_68);
  return;
}

Assistant:

void lowerTee(LocalSet* curr) {
    TempVar highBits = fetchOutParam(curr->value);
    TempVar tmp = getTemp();
    curr->type = Type::i32;
    LocalSet* setLow = builder->makeLocalSet(tmp, curr);
    LocalSet* setHigh = builder->makeLocalSet(
      curr->index + 1, builder->makeLocalGet(highBits, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(tmp, Type::i32);
    Block* result = builder->blockify(setLow, setHigh, getLow);
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }